

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtenvironmentvariables.cpp
# Opt level: O0

bool qputenv(char *varName,QByteArrayView raw)

{
  int iVar1;
  const_pointer str;
  char *__value;
  char *in_RDI;
  long in_FS_OFFSET;
  byte bVar2;
  scoped_lock<QBasicMutex> locker;
  anon_class_1_0_00000001 protect;
  string value;
  QBasicMutex *in_stack_ffffffffffffff58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff60;
  allocator<char> *in_stack_ffffffffffffff68;
  undefined7 in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff77;
  char *in_stack_ffffffffffffff78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  allocator<char> local_3a;
  anon_class_1_0_00000001 local_39;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  undefined1 *local_18;
  undefined1 *puStack_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_39 = (anon_class_1_0_00000001)0xaa;
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_10 = &DAT_aaaaaaaaaaaaaaaa;
  local_38.field_2._M_allocated_capacity = (size_type)&DAT_aaaaaaaaaaaaaaaa;
  local_38.field_2._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  this = &local_38;
  str = QByteArrayView::data((QByteArrayView *)this);
  qputenv::anon_class_1_0_00000001::operator()(&local_39,str);
  QByteArrayView::size((QByteArrayView *)this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (this,in_stack_ffffffffffffff78,
             CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70),in_stack_ffffffffffffff68
            );
  std::allocator<char>::~allocator(&local_3a);
  (anonymous_namespace)::qt_scoped_lock<QBasicMutex,std::scoped_lock<QBasicMutex>>
            (in_stack_ffffffffffffff58);
  __value = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::data
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x25e7f3
                      );
  iVar1 = setenv(in_RDI,__value,1);
  bVar2 = iVar1 == 0;
  std::scoped_lock<QBasicMutex>::~scoped_lock((scoped_lock<QBasicMutex> *)0x25e818);
  std::__cxx11::string::~string(in_stack_ffffffffffffff60);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (bool)(bVar2 & 1);
  }
  __stack_chk_fail();
}

Assistant:

bool qputenv(const char *varName, QByteArrayView raw)
{
    auto protect = [](const char *str) { return str ? str : ""; };

    std::string value{protect(raw.data()), size_t(raw.size())}; // NUL-terminates w/SSO

#if defined(Q_CC_MSVC)
    const auto locker = qt_scoped_lock(environmentMutex);
    return _putenv_s(varName, value.data()) == 0;
#elif (defined(_POSIX_VERSION) && (_POSIX_VERSION-0) >= 200112L) || defined(Q_OS_HAIKU)
    // POSIX.1-2001 has setenv
    const auto locker = qt_scoped_lock(environmentMutex);
    return setenv(varName, value.data(), true) == 0;
#else
    std::string buffer;
    buffer += protect(varName);
    buffer += '=';
    buffer += value;
    char *envVar = qstrdup(buffer.data());
    int result = [&] {
        const auto locker = qt_scoped_lock(environmentMutex);
        return putenv(envVar);
    }();
    if (result != 0) // error. we have to delete the string.
        delete[] envVar;
    return result == 0;
#endif
}